

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *pAVar7;
  LineOrder *pLVar8;
  Compression *pCVar9;
  Box2i *pBVar10;
  LogicExc *this_00;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  OutputStreamMutex *in_RSI;
  long in_RDI;
  char *pixelData;
  char *sampleCountTable;
  Int64 unpackedDataSize;
  Int64 packedDataSize;
  Int64 packedSampleCountSize;
  Int64 dataSize;
  vector<char,_std::allocator<char>_> data;
  stringstream _iex_throw_s_5;
  Box2i *dataWindow;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  Lock lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e0;
  undefined4 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3ec;
  Lock *in_stack_fffffffffffff3f0;
  size_type in_stack_fffffffffffff3f8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff408;
  OutputStreamMutex *in_stack_fffffffffffff410;
  undefined4 in_stack_fffffffffffff418;
  undefined4 in_stack_fffffffffffff41c;
  ChannelList *in_stack_fffffffffffff420;
  int lineBufferMinY;
  ChannelList *in_stack_fffffffffffff428;
  Data *partdata;
  OutputStreamMutex *filedata;
  allocator<char> *sampleCountTableData;
  Int64 in_stack_fffffffffffff448;
  allocator<char> local_991;
  vector<char,_std::allocator<char>_> local_990;
  stringstream local_978 [16];
  ostream local_968 [272];
  pointer in_stack_fffffffffffff7a8;
  char *in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7bc;
  DeepScanLineInputFile *in_stack_fffffffffffff7c0;
  stringstream local_7e8 [16];
  ostream local_7d8 [376];
  stringstream local_660 [16];
  ostream local_650 [376];
  stringstream local_4d8 [16];
  ostream local_4c8 [376];
  stringstream local_350 [16];
  ostream local_340 [376];
  stringstream local_1c8 [16];
  ostream local_1b8 [392];
  Header *local_30;
  undefined8 local_28;
  OutputStreamMutex *local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffff3f0,
             (Mutex *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
             SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
  local_28 = *(undefined8 *)(in_RDI + 8);
  local_30 = DeepScanLineInputFile::header((DeepScanLineInputFile *)local_10);
  bVar3 = Header::hasType((Header *)0x1e403c);
  if (bVar3) {
    Header::type_abi_cxx11_((Header *)0x1e405f);
    bVar3 = std::operator!=(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    if (!bVar3) {
      Header::dataWindow((Header *)0x1e41ea);
      Header::dataWindow((Header *)0x1e4201);
      bVar3 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                        ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffff3f0,
                         (Box<Imath_2_5::Vec2<int>_> *)
                         CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      if (!bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_350);
        poVar5 = std::operator<<(local_340,"Cannot copy pixels from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e427d);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1e42d1);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\". The files have different data windows.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_350);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pLVar8 = Header::lineOrder((Header *)0x1e4385);
      LVar1 = *pLVar8;
      pLVar8 = Header::lineOrder((Header *)0x1e43ad);
      if (LVar1 != *pLVar8) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_4d8);
        poVar5 = std::operator<<(local_4c8,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e4411);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1e4465);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" failed. The files have different line orders.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_4d8);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar9 = Header::compression((Header *)0x1e4519);
      CVar2 = *pCVar9;
      pCVar9 = Header::compression((Header *)0x1e4541);
      if (CVar2 != *pCVar9) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_660);
        poVar5 = std::operator<<(local_650,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e45a5);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1e45f9);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" failed. The files use different compression methods.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_660);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      Header::channels((Header *)0x1e46ad);
      Header::channels((Header *)0x1e46c4);
      bVar3 = ChannelList::operator==(in_stack_fffffffffffff428,in_stack_fffffffffffff420);
      if (bVar3) {
        pBVar10 = Header::dataWindow((Header *)0x1e4848);
        if (*(int *)(*(long *)(in_RDI + 8) + 0xb4) == ((pBVar10->max).y - (pBVar10->min).y) + 1) {
          sampleCountTableData = &local_991;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                     (allocator_type *)in_stack_fffffffffffff3f0);
          std::allocator<char>::~allocator(&local_991);
          while (0 < *(int *)(*(long *)(in_RDI + 8) + 0xb4)) {
            partdata = (Data *)&local_990;
            sVar11 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)partdata);
            filedata = local_10;
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)partdata,0);
            DeepScanLineInputFile::rawPixelData
                      (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0
                       ,(Int64 *)in_stack_fffffffffffff7a8);
            sVar12 = std::vector<char,_std::allocator<char>_>::size(&local_990);
            if (sVar12 < sVar11) {
              std::vector<char,_std::allocator<char>_>::resize
                        (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
              in_stack_fffffffffffff41c = *(undefined4 *)(*(long *)(in_RDI + 8) + 0xb0);
              in_stack_fffffffffffff410 = local_10;
              std::vector<char,_std::allocator<char>_>::operator[](&local_990,0);
              DeepScanLineInputFile::rawPixelData
                        (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,
                         in_stack_fffffffffffff7b0,(Int64 *)in_stack_fffffffffffff7a8);
            }
            lineBufferMinY = (int)(sVar11 >> 0x20);
            in_stack_fffffffffffff3f0 = (Lock *)&local_990;
            pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3f0,4)
            ;
            in_stack_fffffffffffff3e0 =
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pvVar13;
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3f0,0xc);
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3f0,0x14);
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3f0,0);
            in_stack_fffffffffffff3f8 = *(size_type *)(in_RDI + 8);
            in_stack_fffffffffffff400 =
                 *(vector<char,_std::allocator<char>_> **)(in_stack_fffffffffffff3f8 + 0x170);
            iVar4 = Imf_2_5::lineBufferMinY
                              (*(int *)(in_stack_fffffffffffff3f8 + 0xb0),
                               *(int *)(in_stack_fffffffffffff3f8 + 0xc4),
                               *(int *)(in_stack_fffffffffffff3f8 + 0x140));
            anon_unknown_6::writePixelData
                      (filedata,partdata,lineBufferMinY,
                       (char *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       (Int64)in_stack_fffffffffffff410,CONCAT44(iVar4,in_stack_fffffffffffff408),
                       (char *)sampleCountTableData,in_stack_fffffffffffff448);
            if (*(int *)(*(long *)(in_RDI + 8) + 0xb8) == 0) {
              iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0x140);
            }
            else {
              iVar4 = -*(int *)(*(long *)(in_RDI + 8) + 0x140);
            }
            *(int *)(*(long *)(in_RDI + 8) + 0xb0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0xb0);
            *(int *)(*(long *)(in_RDI + 8) + 0xb4) =
                 *(int *)(*(long *)(in_RDI + 8) + 0xb4) - *(int *)(*(long *)(in_RDI + 8) + 0x140);
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff3f0);
          IlmThread_2_5::Lock::~Lock((Lock *)in_stack_fffffffffffff3e0);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_978);
        poVar5 = std::operator<<(local_968,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e48d8);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1e492c);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" failed. \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1e4980);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" already contains pixel data.");
        this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::LogicExc::LogicExc(this_00,local_978);
        __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_7e8);
      poVar5 = std::operator<<(local_7d8,"Quick pixel copy from image file \"");
      pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e4740);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\" to image file \"");
      pcVar6 = fileName((DeepScanLineOutputFile *)0x1e4794);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,"\" failed.  The files have different channel lists.");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar7,local_7e8);
      __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar5 = std::operator<<(local_1b8,"Cannot copy pixels from image file \"");
  pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1e40c9);
  poVar5 = std::operator<<(poVar5,pcVar6);
  poVar5 = std::operator<<(poVar5,"\" to image file \"");
  pcVar6 = fileName((DeepScanLineOutputFile *)0x1e411d);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\": the input needs to be a deep scanline image");
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar7,local_1c8);
  __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile &in)
{

    Lock lock (*_data->_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header();

    if(!inHdr.hasType() || inHdr.type()!=DEEPSCANLINE)
    {
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow() == inHdr.dataWindow()))
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\". "
                            "The files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed. "
                            "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed. "
                            "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed.  "
                            "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i &dataWindow = hdr.dataWindow();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
                              "file \"" << in.fileName() << "\" to image "
                              "file \"" << fileName() << "\" failed. "
                              "\"" << fileName() << "\" already contains "
                              "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data(4096);
    
    while (_data->missingScanLines > 0)
    {
        Int64 dataSize = (Int64) data.size();
        in.rawPixelData(_data->currentScanLine, &data[0], dataSize);
        if(dataSize > data.size())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize(dataSize);
            in.rawPixelData(_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData
        
        Int64 packedSampleCountSize = *(Int64 *) (&data[4]);
        Int64 packedDataSize = *(Int64 *) (&data[12]);
        Int64 unpackedDataSize = *(Int64 *) (&data[20]);
        const char * sampleCountTable = &data[0]+28;
        const char * pixelData = sampleCountTable + packedSampleCountSize;
        
        
        writePixelData (_data->_streamData, _data, lineBufferMinY (_data->currentScanLine,
                                               _data->minY,
                                               _data->linesInBuffer),
                        pixelData, packedDataSize, unpackedDataSize,sampleCountTable,packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)?
                                   _data->linesInBuffer: -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}